

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O0

void __thiscall Psbt_SetOutputRecordTest_Test::TestBody(Psbt_SetOutputRecordTest_Test *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  byte bVar5;
  reference pvVar6;
  uchar *puVar7;
  uchar *puVar8;
  uint *puVar9;
  size_type sVar10;
  char *pcVar11;
  char *in_R9;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> key_list;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  ByteData get_gval2;
  ByteData get_gval1;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  ByteData global_value2;
  ByteData global_key2;
  ByteData global_value1;
  ByteData global_key1;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  KeyData get_val2;
  KeyData get_val1;
  Psbt psbt2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ByteData txout_value2;
  ByteData txout_key2;
  ByteData txout_value1;
  ByteData txout_key1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> plist2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> plist1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fp2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fp1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txout_val_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txout_key_bytes;
  Address addr2;
  Address addr1;
  KeyData key2;
  KeyData key1;
  string path2;
  string path1;
  HDWallet wallet2;
  HDWallet wallet1;
  Psbt psbt;
  bool *in_stack_ffffffffffffec38;
  KeyData *in_stack_ffffffffffffec40;
  undefined7 in_stack_ffffffffffffec48;
  undefined1 in_stack_ffffffffffffec4f;
  allocator_type *in_stack_ffffffffffffec50;
  undefined7 in_stack_ffffffffffffec58;
  undefined1 in_stack_ffffffffffffec5f;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffec60;
  AssertHelper local_1270;
  Message local_1268;
  string local_1260 [32];
  AssertionResult local_1240;
  AssertHelper local_1230;
  Message local_1228;
  string local_1220 [32];
  string local_1200 [32];
  AssertionResult local_11e0;
  AssertHelper local_11d0;
  Message local_11c8;
  string local_11c0 [32];
  string local_11a0 [32];
  AssertionResult local_1180;
  AssertHelper local_1170;
  Message local_1168;
  size_type local_1160;
  undefined4 local_1154;
  AssertionResult local_1150;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_1140;
  AssertHelper local_1128;
  Message local_1120;
  string local_1118 [32];
  string local_10f8 [32];
  AssertionResult local_10d8;
  AssertHelper local_10c8;
  Message local_10c0;
  string local_10b8 [32];
  string local_1098 [32];
  AssertionResult local_1078;
  undefined1 local_1068 [24];
  undefined1 local_1050 [24];
  ByteData local_1038;
  Psbt local_1020;
  string local_fa0;
  AssertHelper local_f80;
  Message local_f78;
  byte local_f69;
  AssertionResult local_f68;
  string local_f58;
  AssertHelper local_f38;
  Message local_f30;
  byte local_f21;
  AssertionResult local_f20;
  string local_f10;
  AssertHelper local_ef0;
  Message local_ee8;
  byte local_ed9;
  AssertionResult local_ed8;
  allocator local_ec1;
  string local_ec0 [32];
  ByteData local_ea0;
  allocator local_e81;
  string local_e80 [39];
  allocator local_e59;
  string local_e58 [32];
  ByteData local_e38;
  allocator local_e19;
  string local_e18 [32];
  ByteData local_df8;
  allocator local_dd9;
  string local_dd8 [39];
  allocator local_db1;
  string local_db0 [32];
  ByteData local_d90;
  AssertHelper local_d78;
  Message local_d70;
  string local_d68 [32];
  string local_d48 [32];
  AssertionResult local_d28;
  AssertHelper local_d18;
  Message local_d10;
  string local_d08 [32];
  string local_ce8 [32];
  AssertionResult local_cc8;
  undefined1 local_cb8 [336];
  undefined1 local_b68 [336];
  ByteData local_a18;
  Psbt local_a00;
  AssertHelper local_980;
  Message local_978;
  string local_970 [32];
  AssertionResult local_950;
  AssertHelper local_940;
  Message local_938 [4];
  string local_918 [32];
  AssertionResult local_8f8;
  ByteData local_8e8;
  ByteData local_8d0;
  ByteData local_8b8;
  ByteData local_8a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_888;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_870 [11];
  vector local_768 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_748;
  Pubkey local_730;
  Address local_718 [376];
  Pubkey local_5a0;
  Address local_588 [376];
  undefined1 local_410 [336];
  undefined1 local_2c0 [343];
  allocator local_169;
  string local_168 [39];
  allocator local_141;
  string local_140 [32];
  ByteData local_120;
  HDWallet local_108 [24];
  ByteData local_f0;
  HDWallet local_d8 [47];
  allocator local_a9;
  string local_a8 [32];
  Psbt local_88;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA="
             ,&local_a9);
  cfd::Psbt::Psbt(&local_88,local_a8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  cfd::core::ByteData::ByteData(&local_f0,(string *)&g_psbt_seed1_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(local_d8,&local_f0);
  cfd::core::ByteData::~ByteData((ByteData *)0x264ebd);
  cfd::core::ByteData::ByteData(&local_120,(string *)&g_psbt_seed2_abi_cxx11_);
  cfd::core::HDWallet::HDWallet(local_108,&local_120);
  cfd::core::ByteData::~ByteData((ByteData *)0x264ef7);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"44h/0h/0h/0/2",&local_141);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"44h/0h/0h/0/2",&local_169);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  cfd::core::HDWallet::GeneratePubkeyData((NetType)local_2c0,(string *)local_d8);
  cfd::core::HDWallet::GeneratePubkeyData((NetType)local_410,(string *)local_108);
  cfd::core::KeyData::GetPubkey();
  cfd::core::Address::Address(local_588,kTestnet,kVersion0,&local_5a0);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x265001);
  cfd::core::KeyData::GetPubkey();
  cfd::core::Address::Address(local_718,kTestnet,kVersion0,&local_730);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x265043);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x265058);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffec60,CONCAT17(in_stack_ffffffffffffec5f,in_stack_ffffffffffffec58)
             ,in_stack_ffffffffffffec50);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x265081);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x26508e);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_748,0);
  *pvVar6 = '\x02';
  cfd::core::KeyData::GetPubkey();
  cfd::core::Pubkey::GetData();
  cfd::core::ByteData::GetBytes();
  cfd::core::ByteData::~ByteData((ByteData *)0x2650f4);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x265101);
  cfd::core::KeyData::GetPubkey();
  cfd::core::Pubkey::GetData();
  cfd::core::ByteData::GetBytes();
  cfd::core::ByteData::~ByteData((ByteData *)0x265153);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x265160);
  cfd::core::KeyData::GetFingerprint();
  cfd::core::ByteData::GetBytes();
  cfd::core::ByteData::~ByteData((ByteData *)0x26519b);
  cfd::core::KeyData::GetFingerprint();
  cfd::core::ByteData::GetBytes();
  cfd::core::ByteData::~ByteData((ByteData *)0x2651d6);
  cfd::core::KeyData::GetChildNumArray();
  cfd::core::KeyData::GetChildNumArray();
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_748,1);
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x26522b);
  pvVar6[0x20] = puVar7[0x20];
  uVar1 = *(undefined8 *)puVar7;
  uVar2 = *(undefined8 *)(puVar7 + 8);
  uVar3 = *(undefined8 *)(puVar7 + 0x18);
  *(undefined8 *)(pvVar6 + 0x10) = *(undefined8 *)(puVar7 + 0x10);
  *(undefined8 *)(pvVar6 + 0x18) = uVar3;
  *(undefined8 *)pvVar6 = uVar1;
  *(undefined8 *)(pvVar6 + 8) = uVar2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_870);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_ffffffffffffec60,CONCAT17(in_stack_ffffffffffffec5f,in_stack_ffffffffffffec58)
            );
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x265283);
  puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x265298);
  *(undefined4 *)puVar7 = *(undefined4 *)puVar8;
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2652b4);
  puVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x2652d5);
  sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_870);
  memcpy(puVar7 + 4,puVar9,sVar10 << 2);
  cfd::core::ByteData::ByteData(&local_8a0,(vector *)&local_748);
  cfd::core::ByteData::ByteData(&local_8b8,local_768);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_748,1);
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x26535b);
  pvVar6[0x20] = puVar7[0x20];
  uVar1 = *(undefined8 *)puVar7;
  uVar2 = *(undefined8 *)(puVar7 + 8);
  uVar3 = *(undefined8 *)(puVar7 + 0x18);
  *(undefined8 *)(pvVar6 + 0x10) = *(undefined8 *)(puVar7 + 0x10);
  *(undefined8 *)(pvVar6 + 0x18) = uVar3;
  *(undefined8 *)pvVar6 = uVar1;
  *(undefined8 *)(pvVar6 + 8) = uVar2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_888);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_ffffffffffffec60,CONCAT17(in_stack_ffffffffffffec5f,in_stack_ffffffffffffec58)
            );
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2653b3);
  puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2653c8);
  *(undefined4 *)puVar7 = *(undefined4 *)puVar8;
  puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2653e4);
  puVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x265405);
  sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_888);
  memcpy(puVar7 + 4,puVar9,sVar10 << 2);
  cfd::core::ByteData::ByteData(&local_8d0,(vector *)&local_748);
  cfd::core::ByteData::ByteData(&local_8e8,local_768);
  cfd::core::Psbt::SetTxOutRecord((uint)&local_88,(ByteData *)0x0,&local_8a0);
  cfd::core::Psbt::SetTxOutRecord((uint)&local_88,(ByteData *)0x1,&local_8d0);
  cfd::core::Psbt::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_8f8,
             "\"70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a5550000000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a5550000000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000"
             ,pcVar11);
  std::__cxx11::string::~string(local_918);
  cfd::core::ByteData::~ByteData((ByteData *)0x265525);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_8f8);
  if (!bVar4) {
    testing::Message::Message(local_938);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2659a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_940,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x51f,pcVar11);
    testing::internal::AssertHelper::operator=(&local_940,local_938);
    testing::internal::AssertHelper::~AssertHelper(&local_940);
    testing::Message::~Message((Message *)0x265a0b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x265a63);
  cfd::core::Psbt::GetBase64_abi_cxx11_();
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_950,
             "\"cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA=\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA="
             ,pcVar11);
  std::__cxx11::string::~string(local_970);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_950);
  if (!bVar4) {
    testing::Message::Message(&local_978);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x265b50);
    testing::internal::AssertHelper::AssertHelper
              (&local_980,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x520,pcVar11);
    testing::internal::AssertHelper::operator=(&local_980,&local_978);
    testing::internal::AssertHelper::~AssertHelper(&local_980);
    testing::Message::~Message((Message *)0x265bb3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x265c0b);
  cfd::core::Psbt::GetData();
  cfd::Psbt::Psbt(&local_a00,&local_a18);
  cfd::core::ByteData::~ByteData((ByteData *)0x265c46);
  cfd::core::Psbt::GetTxOutKeyData((uint)local_b68,false);
  cfd::core::Psbt::GetTxOutKeyData((uint)local_cb8,false);
  cfd::core::KeyData::ToString_abi_cxx11_(SUB81(local_ce8,0),(HardenedType)local_b68,true);
  cfd::core::KeyData::ToString_abi_cxx11_(SUB81(local_d08,0),(HardenedType)local_2c0,true);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffec5f,in_stack_ffffffffffffec58),
             (char *)in_stack_ffffffffffffec50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffec4f,in_stack_ffffffffffffec48),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffec40);
  std::__cxx11::string::~string(local_d08);
  std::__cxx11::string::~string(local_ce8);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_cc8);
  if (!bVar4) {
    testing::Message::Message(&local_d10);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x265e36);
    testing::internal::AssertHelper::AssertHelper
              (&local_d18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x525,pcVar11);
    testing::internal::AssertHelper::operator=(&local_d18,&local_d10);
    testing::internal::AssertHelper::~AssertHelper(&local_d18);
    testing::Message::~Message((Message *)0x265e99);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x265ef1);
  cfd::core::KeyData::ToString_abi_cxx11_(SUB81(local_d48,0),(HardenedType)local_cb8,true);
  cfd::core::KeyData::ToString_abi_cxx11_(SUB81(local_d68,0),(HardenedType)local_410,true);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffec5f,in_stack_ffffffffffffec58),
             (char *)in_stack_ffffffffffffec50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffec4f,in_stack_ffffffffffffec48),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffec40);
  std::__cxx11::string::~string(local_d68);
  std::__cxx11::string::~string(local_d48);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_d28);
  if (!bVar4) {
    testing::Message::Message(&local_d70);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x266034);
    testing::internal::AssertHelper::AssertHelper
              (&local_d78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x526,pcVar11);
    testing::internal::AssertHelper::operator=(&local_d78,&local_d70);
    testing::internal::AssertHelper::~AssertHelper(&local_d78);
    testing::Message::~Message((Message *)0x266097);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2660ef);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_db0,"cfd",&local_db1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_dd8,"dummy1",&local_dd9);
  cfd::core::Psbt::CreateRecordKey((uchar)&local_d90,(string *)0xfc,(uchar)local_db0,(string *)0x0);
  std::__cxx11::string::~string(local_dd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_dd9);
  std::__cxx11::string::~string(local_db0);
  std::allocator<char>::~allocator((allocator<char> *)&local_db1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e18,"01020304",&local_e19);
  cfd::core::ByteData::ByteData(&local_df8,local_e18);
  std::__cxx11::string::~string(local_e18);
  std::allocator<char>::~allocator((allocator<char> *)&local_e19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e58,"cfd",&local_e59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e80,"dummy2",&local_e81);
  cfd::core::Psbt::CreateRecordKey((uchar)&local_e38,(string *)0xfc,(uchar)local_e58,(string *)0x0);
  std::__cxx11::string::~string(local_e80);
  std::allocator<char>::~allocator((allocator<char> *)&local_e81);
  std::__cxx11::string::~string(local_e58);
  std::allocator<char>::~allocator((allocator<char> *)&local_e59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ec0,"00",&local_ec1);
  cfd::core::ByteData::ByteData(&local_ea0,local_ec0);
  std::__cxx11::string::~string(local_ec0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ec1);
  cfd::core::Psbt::SetTxOutRecord((uint)&local_88,(ByteData *)0x0,&local_d90);
  local_ed9 = cfd::core::Psbt::IsFindTxOutRecord((uint)&local_88,(ByteData *)0x0);
  local_ed9 = local_ed9 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffec40,in_stack_ffffffffffffec38,(type *)0x266389
            );
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_ed8);
  if (!bVar4) {
    testing::Message::Message(&local_ee8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f10,(internal *)&local_ed8,
               (AssertionResult *)"psbt.IsFindTxOutRecord(0, global_key1)","false","true",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ef0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x52d,pcVar11);
    testing::internal::AssertHelper::operator=(&local_ef0,&local_ee8);
    testing::internal::AssertHelper::~AssertHelper(&local_ef0);
    std::__cxx11::string::~string((string *)&local_f10);
    testing::Message::~Message((Message *)0x266621);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x266699);
  bVar5 = cfd::core::Psbt::IsFindTxOutRecord((uint)&local_88,(ByteData *)0x0);
  local_f21 = ~bVar5 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffec40,in_stack_ffffffffffffec38,(type *)0x2666de
            );
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_f20);
  if (!bVar4) {
    testing::Message::Message(&local_f30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f58,(internal *)&local_f20,
               (AssertionResult *)"psbt.IsFindTxOutRecord(0, global_key2)","true","false",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x52e,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f38,&local_f30);
    testing::internal::AssertHelper::~AssertHelper(&local_f38);
    std::__cxx11::string::~string((string *)&local_f58);
    testing::Message::~Message((Message *)0x2667d6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x266851);
  cfd::core::Psbt::SetTxOutRecord((uint)&local_88,(ByteData *)0x0,&local_e38);
  local_f69 = cfd::core::Psbt::IsFindTxOutRecord((uint)&local_88,(ByteData *)0x0);
  local_f69 = local_f69 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_ffffffffffffec40,in_stack_ffffffffffffec38,(type *)0x2668b5
            );
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_f68);
  if (!bVar4) {
    testing::Message::Message(&local_f78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_fa0,(internal *)&local_f68,
               (AssertionResult *)"psbt.IsFindTxOutRecord(0, global_key2)","false","true",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x530,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f80,&local_f78);
    testing::internal::AssertHelper::~AssertHelper(&local_f80);
    std::__cxx11::string::~string((string *)&local_fa0);
    testing::Message::~Message((Message *)0x2669ad);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x266a28);
  cfd::core::Psbt::GetData();
  cfd::Psbt::Psbt(&local_1020,&local_1038);
  cfd::Psbt::operator=(&local_a00,&local_1020);
  cfd::Psbt::~Psbt((Psbt *)in_stack_ffffffffffffec40);
  cfd::core::ByteData::~ByteData((ByteData *)0x266a87);
  cfd::core::Psbt::GetTxOutRecord((uint)local_1050,(ByteData *)&local_a00);
  cfd::core::Psbt::GetTxOutRecord((uint)local_1068,(ByteData *)&local_a00);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffec5f,in_stack_ffffffffffffec58),
             (char *)in_stack_ffffffffffffec50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffec4f,in_stack_ffffffffffffec48),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffec40);
  std::__cxx11::string::~string(local_10b8);
  std::__cxx11::string::~string(local_1098);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1078);
  if (!bVar4) {
    testing::Message::Message(&local_10c0);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x266c6e);
    testing::internal::AssertHelper::AssertHelper
              (&local_10c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x535,pcVar11);
    testing::internal::AssertHelper::operator=(&local_10c8,&local_10c0);
    testing::internal::AssertHelper::~AssertHelper(&local_10c8);
    testing::Message::~Message((Message *)0x266ccb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x266d23);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT17(in_stack_ffffffffffffec5f,in_stack_ffffffffffffec58),
             (char *)in_stack_ffffffffffffec50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffec4f,in_stack_ffffffffffffec48),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffec40);
  std::__cxx11::string::~string(local_1118);
  std::__cxx11::string::~string(local_10f8);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_10d8);
  if (!bVar4) {
    testing::Message::Message(&local_1120);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x266e4a);
    testing::internal::AssertHelper::AssertHelper
              (&local_1128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x536,pcVar11);
    testing::internal::AssertHelper::operator=(&local_1128,&local_1120);
    testing::internal::AssertHelper::~AssertHelper(&local_1128);
    testing::Message::~Message((Message *)0x266ea7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x266eff);
  cfd::core::Psbt::GetTxOutRecordKeyList((uint)&local_1140);
  local_1154 = 2;
  local_1160 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                         (&local_1140);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((char *)CONCAT17(in_stack_ffffffffffffec5f,in_stack_ffffffffffffec58),
             (char *)in_stack_ffffffffffffec50,
             (int *)CONCAT17(in_stack_ffffffffffffec4f,in_stack_ffffffffffffec48),
             (unsigned_long *)in_stack_ffffffffffffec40);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1150);
  if (!bVar4) {
    testing::Message::Message(&local_1168);
    pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x266fe7);
    testing::internal::AssertHelper::AssertHelper
              (&local_1170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x539,pcVar11);
    testing::internal::AssertHelper::operator=(&local_1170,&local_1168);
    testing::internal::AssertHelper::~AssertHelper(&local_1170);
    testing::Message::~Message((Message *)0x267044);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26709c);
  sVar10 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size(&local_1140)
  ;
  if (sVar10 == 2) {
    cfd::core::ByteData::GetHex_abi_cxx11_();
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
              (&local_1140,0);
    cfd::core::ByteData::GetHex_abi_cxx11_();
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((char *)CONCAT17(in_stack_ffffffffffffec5f,in_stack_ffffffffffffec58),
               (char *)in_stack_ffffffffffffec50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffec4f,in_stack_ffffffffffffec48),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffec40);
    std::__cxx11::string::~string(local_11c0);
    std::__cxx11::string::~string(local_11a0);
    bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1180);
    if (!bVar4) {
      testing::Message::Message(&local_11c8);
      pcVar11 = testing::AssertionResult::failure_message((AssertionResult *)0x2671e6);
      testing::internal::AssertHelper::AssertHelper
                (&local_11d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x53b,pcVar11);
      testing::internal::AssertHelper::operator=(&local_11d0,&local_11c8);
      testing::internal::AssertHelper::~AssertHelper(&local_11d0);
      testing::Message::~Message((Message *)0x267243);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x26729b);
    cfd::core::ByteData::GetHex_abi_cxx11_();
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
              (&local_1140,1);
    cfd::core::ByteData::GetHex_abi_cxx11_();
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
              ((char *)CONCAT17(in_stack_ffffffffffffec5f,in_stack_ffffffffffffec58),
               (char *)in_stack_ffffffffffffec50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffec4f,in_stack_ffffffffffffec48),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffec40);
    std::__cxx11::string::~string(local_1220);
    std::__cxx11::string::~string(local_1200);
    bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_11e0);
    if (!bVar4) {
      testing::Message::Message(&local_1228);
      in_stack_ffffffffffffec50 =
           (allocator_type *)testing::AssertionResult::failure_message((AssertionResult *)0x2673cf);
      testing::internal::AssertHelper::AssertHelper
                (&local_1230,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x53c,(char *)in_stack_ffffffffffffec50);
      testing::internal::AssertHelper::operator=(&local_1230,&local_1228);
      testing::internal::AssertHelper::~AssertHelper(&local_1230);
      testing::Message::~Message((Message *)0x26742c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x267481);
  }
  cfd::core::Psbt::GetBase64_abi_cxx11_();
  pcVar11 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_1240,
             "\"cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA==\""
             ,"psbt2.GetBase64().c_str()",
             "cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA=="
             ,pcVar11);
  std::__cxx11::string::~string(local_1260);
  bVar4 = testing::AssertionResult::operator_cast_to_bool(&local_1240);
  if (!bVar4) {
    testing::Message::Message(&local_1268);
    in_stack_ffffffffffffec40 =
         (KeyData *)testing::AssertionResult::failure_message((AssertionResult *)0x26756a);
    testing::internal::AssertHelper::AssertHelper
              (&local_1270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x53e,(char *)in_stack_ffffffffffffec40);
    testing::internal::AssertHelper::operator=(&local_1270,&local_1268);
    testing::internal::AssertHelper::~AssertHelper(&local_1270);
    testing::Message::~Message((Message *)0x2675c7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x26761f);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             in_stack_ffffffffffffec50);
  cfd::core::ByteData::~ByteData((ByteData *)0x267639);
  cfd::core::ByteData::~ByteData((ByteData *)0x267646);
  cfd::core::ByteData::~ByteData((ByteData *)0x267653);
  cfd::core::ByteData::~ByteData((ByteData *)0x267660);
  cfd::core::ByteData::~ByteData((ByteData *)0x26766d);
  cfd::core::ByteData::~ByteData((ByteData *)0x26767a);
  cfd::core::KeyData::~KeyData(in_stack_ffffffffffffec40);
  cfd::core::KeyData::~KeyData(in_stack_ffffffffffffec40);
  cfd::Psbt::~Psbt((Psbt *)in_stack_ffffffffffffec40);
  cfd::core::ByteData::~ByteData((ByteData *)0x2676ae);
  cfd::core::ByteData::~ByteData((ByteData *)0x2676bb);
  cfd::core::ByteData::~ByteData((ByteData *)0x2676c8);
  cfd::core::ByteData::~ByteData((ByteData *)0x2676d5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffec50);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffec50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffec50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffec50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffec50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffec50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffec50);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffec50);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffec40);
  cfd::core::Address::~Address((Address *)in_stack_ffffffffffffec40);
  cfd::core::KeyData::~KeyData(in_stack_ffffffffffffec40);
  cfd::core::KeyData::~KeyData(in_stack_ffffffffffffec40);
  std::__cxx11::string::~string(local_168);
  std::__cxx11::string::~string(local_140);
  cfd::core::HDWallet::~HDWallet((HDWallet *)0x267798);
  cfd::core::HDWallet::~HDWallet((HDWallet *)0x2677a5);
  cfd::Psbt::~Psbt((Psbt *)in_stack_ffffffffffffec40);
  return;
}

Assistant:

TEST(Psbt, SetOutputRecordTest) {
  Psbt psbt("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAAAA=");

  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/0/2";
  std::string path2 = "44h/0h/0h/0/2";
  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path2);
  auto addr1 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key1.GetPubkey());
  auto addr2 = Address(NetType::kTestnet, WitnessVersion::kVersion0, key2.GetPubkey());

  std::vector<uint8_t> txout_key_bytes(34);
  std::vector<uint8_t> txout_val_bytes;
  txout_key_bytes[0] = 2;
  auto pk_bytes1 = key1.GetPubkey().GetData().GetBytes();
  auto pk_bytes2 = key2.GetPubkey().GetData().GetBytes();
  auto fp1 = key1.GetFingerprint().GetBytes();
  auto fp2 = key2.GetFingerprint().GetBytes();
  auto plist1 = key1.GetChildNumArray();
  auto plist2 = key2.GetChildNumArray();
  memcpy(&txout_key_bytes[1], pk_bytes1.data(), 33);
  txout_val_bytes.resize(4 + (plist1.size() * 4));
  memcpy(txout_val_bytes.data(), fp1.data(), 4);
  memcpy(&txout_val_bytes.data()[4], plist1.data(), 4 * plist1.size());
  ByteData txout_key1 = ByteData(txout_key_bytes);
  ByteData txout_value1 = ByteData(txout_val_bytes);

  memcpy(&txout_key_bytes[1], pk_bytes2.data(), 33);
  txout_val_bytes.resize(4 + (plist2.size() * 4));
  memcpy(txout_val_bytes.data(), fp2.data(), 4);
  memcpy(&txout_val_bytes.data()[4], plist2.data(), 4 * plist2.size());
  ByteData txout_key2 = ByteData(txout_key_bytes);
  ByteData txout_value2 = ByteData(txout_val_bytes);

  psbt.SetTxOutRecord(0, txout_key1, txout_value1);
  // EXPECT_TRUE(psbt.IsFindTxOutRecord(0, txout_key1));
  // EXPECT_FALSE(psbt.IsFindTxOutRecord(1, txout_key2));
  psbt.SetTxOutRecord(1, txout_key2, txout_value2);
  // EXPECT_TRUE(psbt.IsFindTxOutRecord(1, txout_key2));

  EXPECT_STREQ("70736274ff01004802000000000200e1f50500000000160014b322bddce633b851ac7370ab454f0b367a0654e500e1f50500000000160014cab8c53a6e8fc0296d1cd3915a307d51c491a5550000000000220203473bfc8c770c1b220a2e7aae4badf6c0d7eaf29028d5b29d3438012bb289ef81182a7047602c00008000000080000000800000000002000000002202036474aff2633c351865539fb52b62b9d6fb9e4e23576628e1f0a0a7993458e06c189d6b6d862c0000800000008000000080000000000200000000", psbt.GetData().GetHex().c_str());
  EXPECT_STREQ("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAAACICA2R0r/JjPDUYZVOftStiudb7nk4jV2Yo4fCgp5k0WOBsGJ1rbYYsAACAAAAAgAAAAIAAAAAAAgAAAAA=", psbt.GetBase64().c_str());

  Psbt psbt2(psbt.GetData());
  auto get_val1 = psbt2.GetTxOutKeyData(0);
  auto get_val2 = psbt2.GetTxOutKeyData(1);
  EXPECT_EQ(get_val1.ToString(), key1.ToString());
  EXPECT_EQ(get_val2.ToString(), key2.ToString());

  ByteData global_key1 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy1");
  ByteData global_value1 = ByteData("01020304");
  ByteData global_key2 = Psbt::CreateRecordKey(kProprietary, "cfd", 0, "dummy2");
  ByteData global_value2 = ByteData("00");
  psbt.SetTxOutRecord(0, global_key1, global_value1);
  EXPECT_TRUE(psbt.IsFindTxOutRecord(0, global_key1));
  EXPECT_FALSE(psbt.IsFindTxOutRecord(0, global_key2));
  psbt.SetTxOutRecord(0, global_key2, global_value2);
  EXPECT_TRUE(psbt.IsFindTxOutRecord(0, global_key2));

  psbt2 = Psbt(psbt.GetData());
  auto get_gval1 = psbt2.GetTxOutRecord(0, global_key1);
  auto get_gval2 = psbt2.GetTxOutRecord(0, global_key2);
  EXPECT_EQ(get_gval1.GetHex(), global_value1.GetHex());
  EXPECT_EQ(get_gval2.GetHex(), global_value2.GetHex());

  auto key_list = psbt2.GetTxOutRecordKeyList(0);
  EXPECT_EQ(2, key_list.size());
  if (key_list.size() == 2) {
    EXPECT_EQ(global_key1.GetHex(), key_list[0].GetHex());
    EXPECT_EQ(global_key2.GetHex(), key_list[1].GetHex());
  }
  EXPECT_STREQ("cHNidP8BAEgCAAAAAAIA4fUFAAAAABYAFLMivdzmM7hRrHNwq0VPCzZ6BlTlAOH1BQAAAAAWABTKuMU6bo/AKW0c05FaMH1RxJGlVQAAAAAAIgIDRzv8jHcMGyIKLnquS632wNfq8pAo1bKdNDgBK7KJ74EYKnBHYCwAAIAAAACAAAAAgAAAAAACAAAADfwDY2ZkAAZkdW1teTEEAQIDBA38A2NmZAAGZHVtbXkyAQAAIgIDZHSv8mM8NRhlU5+1K2K51vueTiNXZijh8KCnmTRY4GwYnWtthiwAAIAAAACAAAAAgAAAAAACAAAAAA==", psbt2.GetBase64().c_str());
}